

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

bool __thiscall QToolBarAreaLayoutLine::skip(QToolBarAreaLayoutLine *this)

{
  QToolBarAreaLayoutItem *pQVar1;
  long *plVar2;
  char cVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  uVar4 = (this->toolBarItems).d.size;
  if (uVar4 != 0) {
    lVar6 = 0;
    uVar5 = 0;
    do {
      pQVar1 = (this->toolBarItems).d.ptr;
      if ((&pQVar1->gap)[lVar6] != false) {
        return false;
      }
      plVar2 = *(long **)((long)&pQVar1->widgetItem + lVar6);
      if (plVar2 != (long *)0x0) {
        cVar3 = (**(code **)(*plVar2 + 0x40))();
        if (cVar3 == '\0') {
          return false;
        }
        uVar4 = (this->toolBarItems).d.size;
      }
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0x18;
    } while (uVar5 < uVar4);
  }
  return true;
}

Assistant:

constexpr qsizetype size() const noexcept
    {
#if __has_cpp_attribute(assume)
        constexpr size_t MaxSize = maxSize();
        [[assume(size_t(d.size) <= MaxSize)]];
#endif
        return d.size;
    }